

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpunsafe.c
# Opt level: O3

mp_int * mp_unsafe_shrink(mp_int *x)

{
  ulong uVar1;
  
  uVar1 = x->nw;
  if (1 < uVar1) {
    do {
      if (x->w[uVar1 - 1] != 0) goto LAB_00118e32;
      uVar1 = uVar1 - 1;
    } while (1 < uVar1);
    uVar1 = 1;
  }
LAB_00118e32:
  x->nw = uVar1;
  return x;
}

Assistant:

mp_int *mp_unsafe_shrink(mp_int *x)
{
    x->nw = mp_unsafe_words_needed(x);
    /* This potentially leaves some allocated words between the new
     * and old values of x->nw, which won't be wiped by mp_free now
     * that x->nw doesn't mention that they exist. But we've just
     * checked they're all zero, so we don't need to wipe them now
     * either. */
    return x;
}